

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleWavelet.cpp
# Opt level: O2

double __thiscall TasGrid::RuleWavelet::getSupport(RuleWavelet *this,int point)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double local_18;
  double local_10;
  
  if (this->order == 1) {
    if (point < 3) {
      return 1.0;
    }
    local_10 = 3.0;
    local_18 = 4.0;
    iVar1 = -2;
  }
  else {
    if (point < 9) {
      return 2.0;
    }
    local_10 = 4.2;
    local_18 = 3.0;
    iVar1 = -3;
  }
  iVar2 = Maths::intlog2(point + -1);
  dVar3 = ldexp(1.0,iVar1 + iVar2);
  return local_10 / (dVar3 * local_18);
}

Assistant:

double RuleWavelet::getSupport(int point) const{
    if (order == 1){
        if (point <= 2) return 1.0; // linear-polynomial points
        return 3.0  / ( 4.0 * std::pow(2.0, Maths::intlog2(point - 1) - 2) );
    }else{
        if (point <= 8) return 2.0; // cubic-polynomial points and level 1 have global support
        // the strange 4.2 compensates for numerical errors in computing the cubic-cascade
        return 4.2 / (3.0 * std::pow(2.0, Maths::intlog2(point - 1) - 3));
    }
}